

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDeriveWithOnePo(Abc_Ntk_t *pNtk,Vec_Int_t *vNodeIds,Vec_Int_t *vNodeValues)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  long lVar9;
  
  p = Vec_PtrAlloc(100);
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar4;
  Abc_NtkCleanCopy(pNtk);
  if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
    pAVar5 = Abc_AigConst1(pNtk_00);
    pAVar6 = Abc_AigConst1(pNtk);
    (pAVar6->field_6).pCopy = pAVar5;
  }
  for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,iVar8);
    Abc_NtkDupObj(pNtk_00,pAVar5,1);
  }
  pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar5,"monitor",(char *)0x0);
  for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,iVar8);
    Abc_NtkDupBox(pNtk_00,pAVar5,1);
  }
  iVar8 = 0;
  while( true ) {
    iVar2 = pNtk->vObjs->nSize;
    if (iVar2 <= iVar8) break;
    pAVar5 = Abc_NtkObj(pNtk,iVar8);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_6).pTemp == (void *)0x0)) &&
       ((*(uint *)&pAVar5->field_0x14 & 0xf) != 3)) {
      Abc_NtkDupObj(pNtk_00,pAVar5,0);
    }
    iVar8 = iVar8 + 1;
  }
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,iVar8);
    if ((((pAVar5 != (Abc_Obj_t *)0x0) &&
         (uVar1 = *(uint *)&pAVar5->field_0x14 & 0xf,
         (*(uint *)&pAVar5->field_0x14 & 0xe) != 8 && uVar1 != 3)) && (uVar1 != 5)) && (uVar1 != 10)
       ) {
      for (lVar9 = 0; lVar9 < (pAVar5->vFanins).nSize; lVar9 = lVar9 + 1) {
        Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar9]] + 0x40)
                       );
      }
    }
    iVar2 = pNtk->vObjs->nSize;
  }
  pAVar5 = (Abc_Obj_t *)0x0;
  for (iVar8 = 0; iVar8 < vNodeIds->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(vNodeIds,iVar8);
    iVar3 = Vec_IntEntry(vNodeValues,iVar8);
    pAVar6 = Abc_NtkObj(pNtk,iVar2);
    pAVar6 = (pAVar6->field_6).pCopy;
    if (iVar3 == 0) {
      pAVar6 = Abc_NtkCreateNodeInv(pNtk_00,pAVar6);
    }
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      Vec_PtrGrow(p,2);
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        pAVar7 = pAVar6;
        if (lVar9 == 0) {
          pAVar7 = pAVar5;
        }
        p->pArray[lVar9] = pAVar7;
      }
      p->nSize = 2;
      pAVar6 = Abc_NtkCreateNodeAnd(pNtk_00,p);
    }
    pAVar5 = pAVar6;
  }
  Vec_PtrFree(p);
  pAVar6 = Abc_NtkPo(pNtk_00,0);
  Abc_ObjAddFanin(pAVar6,pAVar5);
  if (pNtk_00->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtkNew) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                  ,0xbbe,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  if (pNtk_00->vCis->nSize != pNtk->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                  ,0xbbf,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  if (pNtk_00->nObjCounts[8] == pNtk->nObjCounts[8]) {
    return pNtk_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                ,0xbc0,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveWithOnePo( Abc_Ntk_t * pNtk, Vec_Int_t * vNodeIds, Vec_Int_t * vNodeValues )
{
    int fCopyNames = 1;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pOutputNew;
    Vec_Ptr_t * vFanins = Vec_PtrAlloc( 100 );
    int i, k, Id, Value;
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    //Abc_NtkForEachPo( pNtk, pObj, i )
    //    Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    // create one PO
    pObjNew = Abc_NtkCreateObj( pNtkNew, ABC_OBJ_PO );
    Abc_ObjAssignName( pObjNew, "monitor", NULL );
    // create boxes
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );

    // duplicate nodes (CIs/COs/latches are already duplicated)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && !Abc_ObjIsPo(pObj) )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects except boxes (they are already connected) and POs (they will be connected later)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // AND nodes (with interters if needed)
    pOutputNew = NULL;
    Vec_IntForEachEntryTwo( vNodeIds, vNodeValues, Id, Value, i )
    {
        pObjNew = Abc_NtkObj( pNtk, Id )->pCopy;
        if ( Value == 0 ) // negative polarity - add inverter
            pObjNew = Abc_NtkCreateNodeInv( pNtkNew, pObjNew );
        if ( pOutputNew == NULL )
            pOutputNew = pObjNew;
        else
        {
            Vec_PtrFillTwo( vFanins, 2, pOutputNew, pObjNew );
            pOutputNew = Abc_NtkCreateNodeAnd( pNtkNew, vFanins );
        }
    }
    Vec_PtrFree( vFanins );
    // create the only POs, which is the AND of the corresponding nodes
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, 0), pOutputNew );

    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPoNum(pNtkNew)    == 1 );
    assert( Abc_NtkCiNum(pNtkNew)    == Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk) );
    return pNtkNew;
}